

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_expression.c
# Opt level: O3

AST * parse_conditional_expression(Translation_Data *translation_data,Scope *scope)

{
  char cVar1;
  AST_Conditional_Expression *left;
  AST *pAVar2;
  AST_Error *pAVar3;
  
  left = (AST_Conditional_Expression *)parse_logical_or_expression(translation_data,scope);
  cVar1 = get_and_check(translation_data,KW_QUESTION);
  if (cVar1 != '\0') {
    pAVar2 = parse_comma_expression(translation_data,scope);
    left = get_conditional_expression_tree((AST *)left,pAVar2,(AST *)0x0);
    cVar1 = get_and_check(translation_data,KW_COLUMN);
    if (cVar1 == '\0') {
      push_translation_error("expected \':\' here",translation_data);
      pAVar3 = get_error_tree((AST *)left);
      return (AST *)pAVar3;
    }
    pAVar2 = parse_conditional_expression(translation_data,scope);
    left->right = pAVar2;
  }
  return (AST *)left;
}

Assistant:

struct AST* parse_conditional_expression(struct Translation_Data *translation_data,struct Scope *scope)
{
	
	struct AST *hold;
	hold=parse_logical_or_expression(translation_data,scope);
	if(get_and_check(translation_data,KW_QUESTION))
	{
		hold=(struct AST*)get_conditional_expression_tree(hold,parse_expression(translation_data,scope),NULL);
		if(get_and_check(translation_data,KW_COLUMN))
		{
			((struct AST_Conditional_Expression*)hold)->right=parse_conditional_expression(translation_data,scope);
			return hold;
		}else
		{
			push_translation_error("expected ':' here",translation_data);
			return (struct AST*)get_error_tree(hold);
		}
	}else
	{
		return hold;
	}
}